

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O2

bool __thiscall
QGenericItemModel::setItemData(QGenericItemModel *this,QModelIndex *index,QMap<int,_QVariant> *data)

{
  bool bVar1;
  
  bVar1 = QGenericItemModelImplBase::call<bool,QModelIndex,QMap<int,QVariant>>
                    (*(QGenericItemModelImplBase **)(this + 0x10),SetItemData,index,data);
  return bVar1;
}

Assistant:

bool QGenericItemModel::setItemData(const QModelIndex &index, const QMap<int, QVariant> &data)
{
    return impl->call<bool>(QGenericItemModelImplBase::SetItemData, index, data);
}